

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::type_caster_generic::load
          (type_caster_generic *this,handle src,bool convert,PyTypeObject *tobj)

{
  type_info *ptVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  PyObject *pPVar4;
  pointer ppVar5;
  pointer pp_Var6;
  vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_> *pvVar7;
  pointer pp_Var8;
  bool bVar9;
  int iVar10;
  internals *piVar11;
  void *pvVar12;
  ulong uVar13;
  __node_base_ptr p_Var14;
  __node_base_ptr p_Var15;
  _func__object_ptr__object_ptr__typeobject_ptr **converter;
  pointer pp_Var16;
  pointer pp_Var17;
  pointer ppVar18;
  bool bVar19;
  iterator __begin4;
  tuple parents;
  iterator __end4;
  undefined1 local_70 [24];
  type_caster_generic *local_58;
  handle local_50;
  iterator local_48;
  
  ptVar1 = this->typeinfo;
  if (ptVar1 == (type_info *)0x0 || src.m_ptr == (PyObject *)0x0) {
    return false;
  }
  if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
    this->value = (void *)0x0;
    return true;
  }
  if (ptVar1->simple_type == true) {
    iVar10 = PyType_IsSubtype(tobj);
    if (iVar10 != 0) {
      pvVar12 = (void *)src.m_ptr[1].ob_refcnt;
LAB_00116668:
      this->value = pvVar12;
      return true;
    }
    goto LAB_00116849;
  }
  if (ptVar1->type == tobj) {
    pvVar12 = (void *)src.m_ptr[1].ob_refcnt;
    goto LAB_00116668;
  }
  piVar11 = get_internals();
  uVar2 = (piVar11->registered_types_py)._M_h._M_bucket_count;
  uVar13 = (ulong)tobj % uVar2;
  p_Var14 = (piVar11->registered_types_py)._M_h._M_buckets[uVar13];
  p_Var15 = (__node_base_ptr)0x0;
  if ((p_Var14 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var14->_M_nxt, p_Var15 = p_Var14, (PyTypeObject *)p_Var14->_M_nxt[1]._M_nxt != tobj
     )) {
    while (p_Var14 = p_Var3, p_Var3 = p_Var14->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var15 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar2 != uVar13) ||
         (p_Var15 = p_Var14, (PyTypeObject *)p_Var3[1]._M_nxt == tobj)) goto LAB_00116680;
    }
    p_Var15 = (__node_base_ptr)0x0;
  }
LAB_00116680:
  if (p_Var15 == (__node_base_ptr)0x0) {
    bVar19 = false;
  }
  else {
    bVar19 = p_Var15->_M_nxt != (_Hash_node_base *)0x0;
  }
  if (((-1 < (int)((tobj->ob_base).ob_base.ob_type)->tp_flags) || (bVar19)) ||
     (pPVar4 = tobj->tp_bases, pPVar4 == (PyObject *)0x0)) {
LAB_00116796:
    ppVar18 = (this->typeinfo->implicit_casts).
              super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (this->typeinfo->implicit_casts).
             super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar9 = false;
    if (ppVar18 != ppVar5) {
      local_58 = this;
      do {
        type_caster_generic((type_caster_generic *)local_70,ppVar18->first);
        bVar19 = load((type_caster_generic *)local_70,src,convert);
        if (bVar19) {
          pvVar12 = (*ppVar18->second)((void *)local_70._8_8_);
          local_58->value = pvVar12;
          object::~object((object *)(local_70 + 0x10));
          if (bVar19) {
            bVar9 = true;
            this = local_58;
            goto LAB_0011683a;
          }
        }
        else {
          object::~object((object *)(local_70 + 0x10));
        }
        ppVar18 = ppVar18 + 1;
      } while (ppVar18 != ppVar5);
      bVar9 = false;
      this = local_58;
    }
  }
  else {
    pPVar4->ob_refcnt = pPVar4->ob_refcnt + 1;
    local_50.m_ptr = pPVar4;
    local_70._0_8_ = PyObject_GetIter();
    local_70[0x10] = false;
    local_70._8_8_ = (PyObject *)0x0;
    local_48.ready = false;
    local_48.super_object.super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_48.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
    while (bVar19 = iterator::operator!=((iterator *)local_70,&local_48), bVar19) {
      if (((bool)local_70[0x10] == false) && ((_object *)local_70._0_8_ != (_object *)0x0)) {
        iterator::advance((iterator *)local_70);
        local_70[0x10] = true;
      }
      bVar9 = load(this,src,convert,(PyTypeObject *)local_70._8_8_);
      if (bVar9) {
        bVar9 = true;
        goto LAB_00116753;
      }
      if ((_object *)local_70._0_8_ != (_object *)0x0) {
        iterator::advance((iterator *)local_70);
      }
    }
    bVar9 = false;
LAB_00116753:
    object::~object(&local_48.value);
    object::~object(&local_48.super_object);
    object::~object((object *)(local_70 + 8));
    object::~object((object *)local_70);
    object::~object((object *)&local_50);
    if (!bVar19) goto LAB_00116796;
  }
LAB_0011683a:
  if (bVar9) {
    return true;
  }
LAB_00116849:
  if (convert) {
    pp_Var16 = (this->typeinfo->implicit_conversions).
               super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pp_Var6 = (this->typeinfo->implicit_conversions).
              super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar19 = pp_Var16 == pp_Var6;
    if (!bVar19) {
      do {
        local_70._0_8_ = (**pp_Var16)(src.m_ptr,this->typeinfo->type);
        object::operator=(&this->temp,(object *)local_70);
        object::~object((object *)local_70);
        bVar9 = load(this,(this->temp).super_handle.m_ptr,false);
        if (bVar9) {
          if (!bVar19) {
            return true;
          }
          break;
        }
        pp_Var16 = pp_Var16 + 1;
        bVar19 = pp_Var16 == pp_Var6;
      } while (!bVar19);
    }
    pvVar7 = this->typeinfo->direct_conversions;
    pp_Var17 = (pvVar7->
               super__Vector_base<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>
               )._M_impl.super__Vector_impl_data._M_start;
    pp_Var8 = (pvVar7->
              super__Vector_base<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    bVar19 = pp_Var17 == pp_Var8;
    if (!bVar19) {
      bVar9 = (**pp_Var17)(src.m_ptr,&this->value);
      while (bVar9 == false) {
        pp_Var17 = pp_Var17 + 1;
        bVar19 = pp_Var17 == pp_Var8;
        if (bVar19) {
          return false;
        }
        bVar9 = (**pp_Var17)(src.m_ptr,&this->value);
      }
      if (!bVar19) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool load(handle src, bool convert, PyTypeObject *tobj) {
        if (!src || !typeinfo)
            return false;
        if (src.is_none()) {
            value = nullptr;
            return true;
        }

        if (typeinfo->simple_type) { /* Case 1: no multiple inheritance etc. involved */
            /* Check if we can safely perform a reinterpret-style cast */
            if (PyType_IsSubtype(tobj, typeinfo->type)) {
                value = reinterpret_cast<instance<void> *>(src.ptr())->value;
                return true;
            }
        } else { /* Case 2: multiple inheritance */
            /* Check if we can safely perform a reinterpret-style cast */
            if (tobj == typeinfo->type) {
                value = reinterpret_cast<instance<void> *>(src.ptr())->value;
                return true;
            }

            /* If this is a python class, also check the parents recursively */
            auto const &type_dict = get_internals().registered_types_py;
            bool new_style_class = PyType_Check((PyObject *) tobj);
            if (type_dict.find(tobj) == type_dict.end() && new_style_class && tobj->tp_bases) {
                auto parents = reinterpret_borrow<tuple>(tobj->tp_bases);
                for (handle parent : parents) {
                    bool result = load(src, convert, (PyTypeObject *) parent.ptr());
                    if (result)
                        return true;
                }
            }

            /* Try implicit casts */
            for (auto &cast : typeinfo->implicit_casts) {
                type_caster_generic sub_caster(*cast.first);
                if (sub_caster.load(src, convert)) {
                    value = cast.second(sub_caster.value);
                    return true;
                }
            }
        }

        /* Perform an implicit conversion */
        if (convert) {
            for (auto &converter : typeinfo->implicit_conversions) {
                temp = reinterpret_steal<object>(converter(src.ptr(), typeinfo->type));
                if (load(temp, false))
                    return true;
            }
            for (auto &converter : *typeinfo->direct_conversions) {
                if (converter(src.ptr(), value))
                    return true;
            }
        }
        return false;
    }